

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

Gia_Man_t * Mf_ManDeriveMappingGia(Mf_Man_t *p)

{
  Gia_Man_t *p_00;
  Vec_Mem_t *p_01;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  Vec_Int_t *vMemory;
  Vec_Int_t *p_05;
  Gia_Man_t *p_06;
  char *pcVar3;
  Gia_Obj_t *pObj_00;
  int *pCut_00;
  word *pTruth_00;
  bool bVar4;
  word *pTruth;
  word uTruth;
  int *pCut;
  int iLit;
  int Id;
  int k;
  int i;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vCover;
  Vec_Int_t *vMapping2;
  Vec_Int_t *vMapping;
  Vec_Int_t *vCopies;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Mf_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p->pGia);
  p_02 = Vec_IntStartFull(iVar1);
  iVar1 = Gia_ManObjNum(p->pGia);
  p_03 = Vec_IntStart(iVar1 * 2 + (int)p->pPars->Edge + (int)p->pPars->Area * 2);
  p_04 = Vec_IntStart((int)p->pPars->Edge + (int)p->pPars->Area * 2 + 1000);
  vMemory = Vec_IntAlloc(0x10000);
  p_05 = Vec_IntAlloc(0x10);
  if (p->pPars->fCutMin == 0) {
    __assert_fail("p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                  ,0x514,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
  }
  iVar1 = Gia_ManObjNum(p->pGia);
  p_06 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pGia->pName);
  p_06->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pGia->pSpec);
  p_06->pSpec = pcVar3;
  Vec_IntWriteEntry(p_02,0,0);
  Id = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->pGia->vCis);
    bVar4 = false;
    if (Id < iVar1) {
      p_00 = p->pGia;
      pObj_00 = Gia_ManCi(p->pGia,Id);
      pCut._4_4_ = Gia_ObjId(p_00,pObj_00);
      bVar4 = pCut._4_4_ != 0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ManAppendCi(p_06);
    Vec_IntWriteEntry(p_02,pCut._4_4_,iVar1);
    Id = Id + 1;
  }
  Id = 0;
  while( true ) {
    bVar4 = false;
    if (Id < p->pGia->nObjs) {
      vCopies = (Vec_Int_t *)Gia_ManObj(p->pGia,Id);
      bVar4 = vCopies != (Vec_Int_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)vCopies);
    if ((iVar1 != 0) && (iVar1 = Mf_ObjMapRefNum(p,Id), iVar1 != 0)) {
      pCut_00 = Mf_ObjCutBest(p,Id);
      iVar1 = Mf_CutSize(pCut_00);
      if (iVar1 == 0) {
        iVar1 = Mf_CutFunc(pCut_00);
        iVar1 = Abc_Lit2Var(iVar1);
        if (iVar1 != 0) {
          __assert_fail("Abc_Lit2Var(Mf_CutFunc(pCut)) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                        ,0x525,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
        }
        iVar1 = Mf_CutFunc(pCut_00);
        Vec_IntWriteEntry(p_02,Id,iVar1);
      }
      else {
        iVar1 = Mf_CutSize(pCut_00);
        if (iVar1 == 1) {
          iVar1 = Mf_CutFunc(pCut_00);
          iVar1 = Abc_Lit2Var(iVar1);
          if (iVar1 != 1) {
            __assert_fail("Abc_Lit2Var(Mf_CutFunc(pCut)) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                          ,0x52b,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
          }
          iVar1 = Vec_IntEntry(p_02,pCut_00[1]);
          iVar2 = Mf_CutFunc(pCut_00);
          iVar2 = Abc_LitIsCompl(iVar2);
          iVar1 = Abc_LitNotCond(iVar1,iVar2);
          Vec_IntWriteEntry(p_02,Id,iVar1);
        }
        else {
          Vec_IntClear(p_05);
          for (iLit = 1; iVar1 = Mf_CutSize(pCut_00), iLit <= iVar1; iLit = iLit + 1) {
            iVar1 = Vec_IntEntry(p_02,pCut_00[iLit]);
            Vec_IntPush(p_05,iVar1);
          }
          p_01 = p->vTtMem;
          iVar1 = Mf_CutFunc(pCut_00);
          iVar1 = Abc_Lit2Var(iVar1);
          pTruth_00 = Vec_MemReadEntry(p_01,iVar1);
          iVar1 = Vec_IntSize(p_05);
          iVar1 = Kit_TruthToGia(p_06,(uint *)pTruth_00,iVar1,vMemory,p_05,0);
          iVar2 = Mf_CutFunc(pCut_00);
          iVar2 = Abc_LitIsCompl(iVar2);
          iVar2 = Abc_LitNotCond(iVar1,iVar2);
          Vec_IntWriteEntry(p_02,Id,iVar2);
          iVar1 = Abc_Lit2Var(iVar1);
          iVar2 = Vec_IntSize(p_04);
          Vec_IntSetEntry(p_03,iVar1,iVar2);
          iVar1 = Vec_IntSize(p_05);
          Vec_IntPush(p_04,iVar1);
          for (iLit = 0; iVar1 = Vec_IntSize(p_05), iLit < iVar1; iLit = iLit + 1) {
            iVar1 = Vec_IntEntry(p_05,iLit);
            iVar1 = Abc_Lit2Var(iVar1);
            Vec_IntPush(p_04,iVar1);
          }
          iVar1 = Vec_IntEntry(p_02,Id);
          iVar1 = Abc_Lit2Var(iVar1);
          Vec_IntPush(p_04,iVar1);
        }
      }
    }
    Id = Id + 1;
  }
  Id = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->pGia->vCos);
    bVar4 = false;
    if (Id < iVar1) {
      vCopies = (Vec_Int_t *)Gia_ManCo(p->pGia,Id);
      bVar4 = vCopies != (Vec_Int_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjFaninId0p(p->pGia,(Gia_Obj_t *)vCopies);
    iVar1 = Vec_IntEntry(p_02,iVar1);
    iVar2 = Gia_ObjFaninC0((Gia_Obj_t *)vCopies);
    iVar1 = Abc_LitNotCond(iVar1,iVar2);
    Gia_ManAppendCo(p_06,iVar1);
    Id = Id + 1;
  }
  Vec_IntFree(p_02);
  Vec_IntFree(vMemory);
  Vec_IntFree(p_05);
  iVar1 = Vec_IntSize(p_03);
  iVar2 = Gia_ManObjNum(p_06);
  if (iVar2 < iVar1) {
    iVar1 = Gia_ManObjNum(p_06);
    Vec_IntShrink(p_03,iVar1);
  }
  else {
    iVar1 = Gia_ManObjNum(p_06);
    Vec_IntFillExtra(p_03,iVar1,0);
  }
  iVar1 = Vec_IntSize(p_03);
  iVar2 = Gia_ManObjNum(p_06);
  if (iVar1 == iVar2) {
    for (Id = 0; iVar1 = Vec_IntSize(p_03), Id < iVar1; Id = Id + 1) {
      iVar1 = Vec_IntEntry(p_03,Id);
      if (0 < iVar1) {
        iVar1 = Gia_ManObjNum(p_06);
        Vec_IntAddToEntry(p_03,Id,iVar1);
      }
    }
    Vec_IntAppend(p_03,p_04);
    Vec_IntFree(p_04);
    if (p_06->vMapping == (Vec_Int_t *)0x0) {
      p_06->vMapping = p_03;
      iVar1 = Gia_ManRegNum(p->pGia);
      Gia_ManSetRegNum(p_06,iVar1);
      return p_06;
    }
    __assert_fail("pNew->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                  ,0x551,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
  }
  __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                ,0x54a,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
}

Assistant:

Gia_Man_t * Mf_ManDeriveMappingGia( Mf_Man_t * p )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vMapping  = Vec_IntStart( 2 * Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + 2 * (int)p->pPars->Area );
    Vec_Int_t * vMapping2 = Vec_IntStart( (int)p->pPars->Edge + 2 * (int)p->pPars->Area + 1000 );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    int i, k, Id, iLit, * pCut;
    word uTruth = 0, * pTruth = &uTruth;
    assert( p->pPars->fCutMin );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    // map primary inputs
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachCiId( p->pGia, Id, i )
        Vec_IntWriteEntry( vCopies, Id, Gia_ManAppendCi(pNew) );
    // iterate through nodes used in the mapping
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        if ( Mf_CutSize(pCut) == 0 )
        {
            assert( Abc_Lit2Var(Mf_CutFunc(pCut)) == 0 );
            Vec_IntWriteEntry( vCopies, i, Mf_CutFunc(pCut) );
            continue;
        }
        if ( Mf_CutSize(pCut) == 1 )
        {
            assert( Abc_Lit2Var(Mf_CutFunc(pCut)) == 1 );
            iLit = Vec_IntEntry( vCopies, pCut[1] );
            Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(Mf_CutFunc(pCut))) );
            continue;
        }
        Vec_IntClear( vLeaves );
        for ( k = 1; k <= Mf_CutSize(pCut); k++ )
            Vec_IntPush( vLeaves, Vec_IntEntry(vCopies, pCut[k]) );
        pTruth = Vec_MemReadEntry( p->vTtMem, Abc_Lit2Var(Mf_CutFunc(pCut)) );
        iLit = Kit_TruthToGia( pNew, (unsigned *)pTruth, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
        Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(Mf_CutFunc(pCut))) );
        // create mapping
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLit), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
        Vec_IntForEachEntry( vLeaves, iLit, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iLit) );
        Vec_IntPush( vMapping2, Abc_Lit2Var(Vec_IntEntry(vCopies, i)) );
    }
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
        iLit = Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
    }
    Vec_IntFree( vCopies );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, iLit, i )
        if ( iLit > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    pNew->vMapping = vMapping;
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
    return pNew;
}